

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_BitfieldArgument_Test::TestBody
          (ParallelFlatHashSet_BitfieldArgument_Test *this)

{
  iterator i;
  const_iterator cVar1;
  initializer_list<int> ilist;
  initializer_list<int> iVar2;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator>
  local_4d0;
  int local_470;
  int local_46c;
  iterator local_468;
  int local_434;
  int local_430;
  int local_42c;
  int local_428;
  int local_424;
  iterator local_420;
  undefined8 local_418;
  iterator local_410;
  int local_3dc;
  iterator local_3d8;
  const_iterator local_3a8;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator,_bool>
  local_378;
  int local_340 [4];
  allocator<int> local_32f;
  key_equal local_32e;
  hasher local_32d;
  int local_32c;
  iterator local_328;
  size_type local_320;
  undefined1 local_318 [8];
  parallel_flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>,_4UL,_phmap::NullMutex>
  s;
  int n;
  ParallelFlatHashSet_BitfieldArgument_Test *this_local;
  
  s.
  super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  .sets_._M_elems[0xf].set_.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_1_ =
       s.
       super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
       .sets_._M_elems[0xf].set_.settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
       .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_1_ & 0xfe;
  local_32c = 0;
  local_328 = &local_32c;
  local_320 = 1;
  std::allocator<int>::allocator(&local_32f);
  iVar2._M_len = local_320;
  iVar2._M_array = local_328;
  parallel_flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set((parallel_flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>,_4UL,_phmap::NullMutex>
                       *)local_318,iVar2,0,&local_32d,&local_32e,&local_32f);
  std::allocator<int>::~allocator(&local_32f);
  local_340[0] = -(s.
                   super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                   .sets_._M_elems[0xf].set_.settings_.
                   super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                   .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_1_ & 1);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::insert<int,_0,_0>(&local_378,
                      (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                       *)local_318,local_340);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::end(&local_3d8,
        (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
         *)local_318);
  i.inner_end_ = local_3d8.inner_end_;
  i.inner_ = local_3d8.inner_;
  i.it_.ctrl_ = local_3d8.it_.ctrl_;
  i.it_.field_1.slot_ = local_3d8.it_.field_1.slot_;
  i.it_end_.ctrl_ = local_3d8.it_end_.ctrl_;
  i.it_end_.field_1.slot_ = local_3d8.it_end_.field_1.slot_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::const_iterator::const_iterator(&local_3a8,i);
  local_3dc = -(s.
                super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .sets_._M_elems[0xf].set_.settings_.
                super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_1_ & 1);
  cVar1.iter_.inner_end_ = local_3a8.iter_.inner_end_;
  cVar1.iter_.inner_ = local_3a8.iter_.inner_;
  cVar1.iter_.it_.ctrl_ = local_3a8.iter_.it_.ctrl_;
  cVar1.iter_.it_.field_1.slot_ = local_3a8.iter_.it_.field_1.slot_;
  cVar1.iter_.it_end_.ctrl_ = local_3a8.iter_.it_end_.ctrl_;
  cVar1.iter_.it_end_.field_1.slot_ = local_3a8.iter_.it_end_.field_1.slot_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::insert<int,_0,_0>(&local_410,
                      (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                       *)local_318,cVar1,&local_3dc);
  local_424 = -(s.
                super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .sets_._M_elems[0xf].set_.settings_.
                super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_1_ & 1);
  local_420 = &local_424;
  local_418 = 1;
  ilist._M_len = 1;
  ilist._M_array = local_420;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::insert((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
            *)local_318,ilist);
  local_428 = -(s.
                super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .sets_._M_elems[0xf].set_.settings_.
                super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_1_ & 1);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::erase<int>((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                *)local_318,&local_428);
  local_42c = -(s.
                super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .sets_._M_elems[0xf].set_.settings_.
                super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_1_ & 1);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::count<int>((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                *)local_318,&local_42c);
  local_430 = -(s.
                super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .sets_._M_elems[0xf].set_.settings_.
                super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_1_ & 1);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::prefetch<int>((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                   *)local_318,&local_430);
  local_434 = -(s.
                super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .sets_._M_elems[0xf].set_.settings_.
                super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_1_ & 1);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::find<int>(&local_468,
              (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
               *)local_318,&local_434);
  local_46c = -(s.
                super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .sets_._M_elems[0xf].set_.settings_.
                super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_1_ & 1);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::contains<int>((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                   *)local_318,&local_46c);
  local_470 = -(s.
                super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .sets_._M_elems[0xf].set_.settings_.
                super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_1_ & 1);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::equal_range<int>(&local_4d0,
                     (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                      *)local_318,&local_470);
  parallel_flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_set
            ((parallel_flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>,_4UL,_phmap::NullMutex>
              *)local_318);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, BitfieldArgument) {
  union {
    int n : 1;
  };
  n = 0;
  phmap::THIS_HASH_SET<int> s = {n};
  s.insert(n);
  s.insert(s.end(), n);
  s.insert({n});
  s.erase(n);
  s.count(n);
  s.prefetch(n);
  s.find(n);
  s.contains(n);
  s.equal_range(n);
}